

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O3

void __thiscall libtorrent::aux::socks5::handshake2(socks5 *this,error_code *e)

{
  char cVar1;
  size_t __n;
  size_type sVar2;
  uchar val_1;
  uchar val;
  alert_manager *this_00;
  char *__dest;
  error_code ec;
  transfer_all_t local_69;
  undefined1 local_68 [8];
  undefined8 local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  mutable_buffer local_48;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  socket *local_28;
  
  if (this->m_abort != false) {
    return;
  }
  if (e->failed_ == true) {
    if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
      local_68[0] = 0x28;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                (this->m_alerts,&this->m_proxy_addr,local_68,e);
    }
    this->m_failures = this->m_failures + 1;
    retry_connection(this);
    return;
  }
  if ((byte)(this->m_tmp_buf)._M_elems[0] < 5) {
    this_00 = this->m_alerts;
    if (((this_00->m_alert_mask)._M_i.m_val & 1) == 0) goto LAB_00377892;
    local_68._0_4_ = 1;
  }
  else {
    cVar1 = (this->m_tmp_buf)._M_elems[1];
    if (cVar1 == '\x02') {
      __n = (this->m_proxy_settings).username._M_string_length;
      if (__n != 0) {
        (this->m_tmp_buf)._M_elems[0] = '\x01';
        (this->m_tmp_buf)._M_elems[1] = (char)__n;
        memcpy((this->m_tmp_buf)._M_elems + 2,(this->m_proxy_settings).username._M_dataplus._M_p,__n
              );
        sVar2 = (this->m_proxy_settings).username._M_string_length;
        __dest = (this->m_tmp_buf)._M_elems + sVar2 + 3;
        (this->m_tmp_buf)._M_elems[sVar2 + 2] =
             (char)(this->m_proxy_settings).password._M_string_length;
        memcpy(__dest,(this->m_proxy_settings).password._M_dataplus._M_p,
               (this->m_proxy_settings).password._M_string_length);
        local_48.size_ =
             (size_t)(__dest + ((this->m_proxy_settings).password._M_string_length -
                               (long)&this->m_tmp_buf));
        local_48.data_ = &this->m_tmp_buf;
        ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::socks5,void>
                  ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                   (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
        local_68 = (undefined1  [8])handshake3;
        local_60 = (system_error_category *)0x0;
        local_58 = local_38;
        _Stack_50._M_pi = p_Stack_30;
        local_38 = (element_type *)0x0;
        p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_28 = &this->m_socks5_sock;
        boost::asio::detail::
        initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
        ::operator()((initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
                      *)&local_28,
                     (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)local_68,&local_48,&local_69);
        if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
        }
        if (p_Stack_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return;
        }
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
        return;
      }
      this_00 = this->m_alerts;
      if (((this_00->m_alert_mask)._M_i.m_val & 1) == 0) goto LAB_00377892;
      local_68._0_4_ = 5;
    }
    else {
      if (cVar1 == '\0') {
        socks_forward_udp(this);
        return;
      }
      this_00 = this->m_alerts;
      if (((this_00->m_alert_mask)._M_i.m_val & 1) == 0) goto LAB_00377892;
      local_68._0_4_ = 2;
    }
  }
  local_48.data_ = (void *)CONCAT71(local_48.data_._1_7_,0x28);
  alert_manager::
  emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,libtorrent::socks_error::socks_error_code>
            (this_00,&this->m_proxy_addr,(operation_t *)&local_48,(socks_error_code *)local_68);
LAB_00377892:
  local_68 = (undefined1  [8])((ulong)local_68 & 0xffffff0000000000);
  local_60 = &boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::detail::reactive_socket_service_base::close
            (&((this->m_socks5_sock).
               super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_)->super_reactive_socket_service_base,(int)this + 0x18);
  return;
}

Assistant:

void socks5::handshake2(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_handshake2");
	if (m_abort) return;

	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const version = read_uint8(p);
	int const method = read_uint8(p);

	if (version < 5)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
				, socks_error::unsupported_version);
		error_code ec;
		m_socks5_sock.close(ec);
		return;
	}

	if (method == 0)
	{
		socks_forward_udp(/*l*/);
	}
	else if (method == 2)
	{
		if (m_proxy_settings.username.empty())
		{
			if (m_alerts.should_post<socks5_alert>())
				m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
					, socks_error::username_required);
			error_code ec;
			m_socks5_sock.close(ec);
			return;
		}

		// start sub-negotiation
		p = m_tmp_buf.data();
		write_uint8(1, p);
		TORRENT_ASSERT(m_proxy_settings.username.size() < 0x100);
		write_uint8(uint8_t(m_proxy_settings.username.size()), p);
		write_string(m_proxy_settings.username, p);
		TORRENT_ASSERT(m_proxy_settings.password.size() < 0x100);
		write_uint8(uint8_t(m_proxy_settings.password.size()), p);
		write_string(m_proxy_settings.password, p);
		TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
		ADD_OUTSTANDING_ASYNC("socks5::on_handshake3");
		boost::asio::async_write(m_socks5_sock
			, boost::asio::buffer(m_tmp_buf.data(), aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
			, std::bind(&socks5::handshake3, self(), _1));
	}
	else
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake
				, socks_error::unsupported_authentication_method);

		error_code ec;
		m_socks5_sock.close(ec);
		return;
	}
}